

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps2,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps3,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec3,int *idx3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int *rn3,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  undefined8 *puVar1;
  uint *puVar2;
  bool bVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  undefined4 uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  uint local_414;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int *local_3b0;
  cpp_dec_float<50U,_int,_void> local_368;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_a8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_a8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_a8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_a8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_a8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
  local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
  local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
  local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
  local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
  local_e8.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
  local_e8.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
  local_e8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
  vSolveLright3(this,rhs,ridx,rn,&local_68,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._24_8_,(int *)eps2.m_backend.data._M_elems._32_8_,
                (int *)eps2.m_backend._40_8_,&local_a8,rhs2,ridx2,rn2,&local_e8);
  piVar6 = (this->row).perm;
  if (eps3.m_backend.data._M_elems._0_8_ == 0) {
    if (*rn < 1) {
      iVar14 = 0;
    }
    else {
      lVar20 = 0;
      uVar21 = 0;
      do {
        uVar17 = (uint)uVar21;
        iVar14 = ridx[lVar20];
        result.m_backend.exp = rhs[iVar14].m_backend.exp;
        result.m_backend.neg = rhs[iVar14].m_backend.neg;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[iVar14].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar14].m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[iVar14].m_backend.data._M_elems + 2);
        puVar2 = rhs[iVar14].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        result.m_backend.fpclass = rhs[iVar14].m_backend.fpclass;
        result.m_backend.prec_elem = rhs[iVar14].m_backend.prec_elem;
        local_2e8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_2e8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_2e8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_2e8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_2e8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_2e8.exp = (eps->m_backend).exp;
        local_2e8.neg = (eps->m_backend).neg;
        local_2e8.fpclass = (eps->m_backend).fpclass;
        local_2e8.prec_elem = (eps->m_backend).prec_elem;
        if ((result.m_backend.neg == true) &&
           (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        if ((local_2e8.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN
            ) || (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&result.m_backend,&local_2e8), iVar13 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar14].m_backend,0);
        }
        else {
          iVar14 = piVar6[iVar14];
          uVar15 = uVar17;
          if (0 < (int)uVar17) {
            do {
              uVar22 = (uint)uVar21 - 1;
              uVar16 = uVar22 >> 1;
              uVar15 = (uint)uVar21;
              if (iVar14 <= ridx[uVar16]) break;
              ridx[uVar21] = ridx[uVar16];
              uVar21 = (ulong)uVar16;
              uVar15 = uVar16;
            } while (1 < uVar22);
          }
          uVar21 = (ulong)(uVar17 + 1);
          ridx[(int)uVar15] = iVar14;
        }
        iVar14 = (int)uVar21;
        lVar20 = lVar20 + 1;
      } while (lVar20 < *rn);
    }
    *rn = iVar14;
  }
  else {
    if (*rn < 1) {
      local_414 = 0;
    }
    else {
      local_3b0 = (int *)eps3.m_backend.data._M_elems._16_8_;
      lVar20 = 0;
      local_414 = 0;
      do {
        iVar14 = ridx[lVar20];
        lVar18 = (long)iVar14;
        lVar23 = lVar18 * 0x38;
        uVar7 = *(undefined8 *)(rhs[lVar18].m_backend.data._M_elems + 8);
        uVar8 = *(undefined8 *)rhs[lVar18].m_backend.data._M_elems;
        uVar9 = *(undefined8 *)(rhs[lVar18].m_backend.data._M_elems + 2);
        puVar2 = rhs[lVar18].m_backend.data._M_elems + 4;
        uVar10 = *(undefined8 *)puVar2;
        uVar11 = *(undefined8 *)(puVar2 + 2);
        iVar13 = rhs[lVar18].m_backend.exp;
        bVar3 = rhs[lVar18].m_backend.neg;
        fVar4 = rhs[lVar18].m_backend.fpclass;
        iVar5 = rhs[lVar18].m_backend.prec_elem;
        result.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(rhs[lVar18].m_backend.data._M_elems + 8);
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar18].m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[lVar18].m_backend.data._M_elems + 2);
        puVar2 = rhs[lVar18].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_2a8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_2a8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_2a8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_2a8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_2a8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_2a8.exp = (eps->m_backend).exp;
        local_2a8.neg = (eps->m_backend).neg;
        local_2a8.fpclass = (eps->m_backend).fpclass;
        local_2a8.prec_elem = (eps->m_backend).prec_elem;
        result.m_backend.prec_elem = iVar5;
        result.m_backend.fpclass = fVar4;
        result.m_backend.neg = bVar3;
        if ((bVar3 == true) &&
           (result.m_backend.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        result.m_backend.exp = iVar13;
        if ((local_2a8.fpclass == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) ||
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result.m_backend,&local_2a8), iVar12 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[lVar18].m_backend,0);
        }
        else {
          *local_3b0 = iVar14;
          iVar14 = piVar6[lVar18];
          uVar17 = local_414;
          if (0 < (int)local_414) {
            do {
              uVar15 = uVar17 - 1;
              uVar16 = uVar15 >> 1;
              if (iVar14 <= ridx[uVar16]) break;
              ridx[uVar17] = ridx[uVar16];
              uVar17 = uVar16;
            } while (1 < uVar15);
          }
          local_3b0 = local_3b0 + 1;
          local_414 = local_414 + 1;
          ridx[(int)uVar17] = iVar14;
          *(undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + 0x20 + lVar23) = uVar7;
          puVar1 = (undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + 0x10 + lVar23);
          *puVar1 = uVar10;
          puVar1[1] = uVar11;
          *(undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + lVar23) = uVar8;
          ((undefined8 *)(eps3.m_backend.data._M_elems._0_8_ + lVar23))[1] = uVar9;
          *(int *)(eps3.m_backend.data._M_elems._0_8_ + 0x28 + lVar23) = iVar13;
          *(bool *)(eps3.m_backend.data._M_elems._0_8_ + 0x2c + lVar23) = bVar3;
          *(fpclass_type *)(eps3.m_backend.data._M_elems._0_8_ + 0x30 + lVar23) = fVar4;
          *(int32_t *)(eps3.m_backend.data._M_elems._0_8_ + 0x34 + lVar23) = iVar5;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < *rn);
    }
    *rn = local_414;
    *(uint *)eps3.m_backend.data._M_elems._8_8_ = local_414;
  }
  iVar14 = 0;
  uVar19 = 0;
  if (0 < *(int *)eps2.m_backend._40_8_) {
    lVar20 = 0;
    uVar21 = 0;
    do {
      uVar17 = (uint)uVar21;
      lVar23 = (long)*(int *)(eps2.m_backend.data._M_elems._32_8_ + lVar20 * 4);
      lVar18 = lVar23 * 0x38;
      result.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._24_8_ + 0x28 + lVar18);
      result.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._24_8_ + 0x2c + lVar18);
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x20 + lVar18);
      result.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar18);
      result.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._24_8_ + lVar18) + 2);
      puVar2 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x10 + lVar18);
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      result.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x30 + lVar18)
      ;
      local_328.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
      local_328.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
      local_328.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
      local_328.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
      local_328.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
      local_328.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
      local_328.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
      local_328._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
      if ((result.m_backend.neg == true) &&
         (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite
         )) {
        result.m_backend.neg = false;
      }
      if ((local_328.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN)
         || (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&result.m_backend,&local_328), iVar13 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)(lVar18 + eps2.m_backend.data._M_elems._24_8_),0
                  );
      }
      else {
        iVar13 = piVar6[lVar23];
        uVar15 = uVar17;
        if (0 < (int)uVar17) {
          do {
            uVar22 = (uint)uVar21 - 1;
            uVar16 = uVar22 >> 1;
            iVar12 = *(int *)(eps2.m_backend.data._M_elems._32_8_ + (ulong)uVar16 * 4);
            uVar15 = (uint)uVar21;
            if (iVar13 <= iVar12) break;
            *(int *)(eps2.m_backend.data._M_elems._32_8_ + uVar21 * 4) = iVar12;
            uVar21 = (ulong)uVar16;
            uVar15 = uVar16;
          } while (1 < uVar22);
        }
        uVar21 = (ulong)(uVar17 + 1);
        *(int *)(eps2.m_backend.data._M_elems._32_8_ + (long)(int)uVar15 * 4) = iVar13;
      }
      uVar19 = (undefined4)uVar21;
      lVar20 = lVar20 + 1;
    } while (lVar20 < *(int *)eps2.m_backend._40_8_);
  }
  *(undefined4 *)eps2.m_backend._40_8_ = uVar19;
  if (0 < *rn2) {
    lVar20 = 0;
    uVar21 = 0;
    do {
      uVar17 = (uint)uVar21;
      iVar14 = ridx2[lVar20];
      result.m_backend.exp = rhs2[iVar14].m_backend.exp;
      result.m_backend.neg = rhs2[iVar14].m_backend.neg;
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(rhs2[iVar14].m_backend.data._M_elems + 8);
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs2[iVar14].m_backend.data._M_elems;
      result.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs2[iVar14].m_backend.data._M_elems + 2);
      puVar2 = rhs2[iVar14].m_backend.data._M_elems + 4;
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      result.m_backend.fpclass = rhs2[iVar14].m_backend.fpclass;
      result.m_backend.prec_elem = rhs2[iVar14].m_backend.prec_elem;
      local_368.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
      local_368.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
      local_368.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
      local_368.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
      local_368.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
      local_368.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
      local_368.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
      local_368._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
      if ((result.m_backend.neg == true) &&
         (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite
         )) {
        result.m_backend.neg = false;
      }
      if ((local_368.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN)
         || (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&result.m_backend,&local_368), iVar13 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&rhs2[iVar14].m_backend,0);
      }
      else {
        iVar14 = piVar6[iVar14];
        uVar15 = uVar17;
        if (0 < (int)uVar17) {
          do {
            uVar22 = (uint)uVar21 - 1;
            uVar16 = uVar22 >> 1;
            uVar15 = (uint)uVar21;
            if (iVar14 <= ridx2[uVar16]) break;
            ridx2[uVar21] = ridx2[uVar16];
            uVar21 = (ulong)uVar16;
            uVar15 = uVar16;
          } while (1 < uVar22);
        }
        uVar21 = (ulong)(uVar17 + 1);
        ridx2[(int)uVar15] = iVar14;
      }
      iVar14 = (int)uVar21;
      lVar20 = lVar20 + 1;
    } while (lVar20 < *rn2);
  }
  *rn2 = iVar14;
  local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_128.m_backend.exp = (eps->m_backend).exp;
  local_128.m_backend.neg = (eps->m_backend).neg;
  local_128.m_backend.fpclass = (eps->m_backend).fpclass;
  local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar14 = vSolveUright(this,vec,idx,rhs,ridx,*rn,&local_128);
  *rn = iVar14;
  local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_168.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_168.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_168.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_168.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_168.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
  local_168.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  iVar14 = vSolveUright(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)eps2.m_backend.data._M_elems._8_8_,
                        (int *)eps2.m_backend.data._M_elems._16_8_,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)eps2.m_backend.data._M_elems._24_8_,
                        (int *)eps2.m_backend.data._M_elems._32_8_,*(int *)eps2.m_backend._40_8_,
                        &local_168);
  *(int *)eps2.m_backend._40_8_ = iVar14;
  local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
  local_1a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
  local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
  local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
  local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
  local_1a8.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
  local_1a8.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
  local_1a8.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
  iVar14 = vSolveUright(this,vec2,idx2,rhs2,ridx2,*rn2,&local_1a8);
  *rn2 = iVar14;
  if ((this->l).updateType == 0) {
    local_1e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_1e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_1e8.m_backend.exp = (eps->m_backend).exp;
    local_1e8.m_backend.neg = (eps->m_backend).neg;
    local_1e8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_1e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar14 = vSolveUpdateRight(this,vec,idx,*rn,&local_1e8);
    *rn = iVar14;
    local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
    local_228.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
    local_228.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
    local_228.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
    local_228.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
    local_228.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
    local_228.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x2c);
    local_228.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
    iVar14 = vSolveUpdateRight(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)eps2.m_backend.data._M_elems._8_8_,
                               (int *)eps2.m_backend.data._M_elems._16_8_,
                               *(int *)eps2.m_backend._40_8_,&local_228);
    *(int *)eps2.m_backend._40_8_ = iVar14;
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend._48_8_;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 8);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x10);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x18);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x20);
    local_268.m_backend.exp = *(int *)(eps2.m_backend._48_8_ + 0x28);
    local_268.m_backend.neg = *(bool *)(eps2.m_backend._48_8_ + 0x2c);
    local_268.m_backend._48_8_ = *(undefined8 *)(eps2.m_backend._48_8_ + 0x30);
    iVar14 = vSolveUpdateRight(this,vec2,idx2,*rn2,&local_268);
    *rn2 = iVar14;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}